

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerlaw_dist.hpp
# Opt level: O1

result_type_conflict1 __thiscall
trng::powerlaw_dist<float>::icdf(powerlaw_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  int *piVar2;
  result_type_conflict1 rVar3;
  float fVar4;
  
  if ((x <= 0.0) || (1.0 <= x)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    rVar3 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    if ((x != 1.0) || (NAN(x))) {
      fVar1 = (this->P).theta_;
      fVar4 = powf(1.0 - x,-1.0 / (this->P).gamma_);
      rVar3 = fVar4 * fVar1;
    }
    else {
      rVar3 = INFINITY;
    }
  }
  else {
    rVar3 = (this->P).theta_;
  }
  return rVar3;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return P.theta();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return P.theta() * math::pow(1 - x, -1 / P.gamma());
    }